

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::UpdateDefinition(Element *this)

{
  bool bVar1;
  ElementStyle *this_00;
  reference this_01;
  pointer pEVar2;
  ElementPtr *child;
  iterator __end2;
  iterator __begin2;
  OwnedElementList *__range2;
  Element *this_local;
  
  if (((byte)this->field_0x17 >> 1 & 1) != 0) {
    this->field_0x17 = this->field_0x17 & 0xfd;
    this->field_0x17 = this->field_0x17 & 0xfb | 4;
    this_00 = GetStyle(this);
    ElementStyle::UpdateDefinition(this_00);
  }
  if (((byte)this->field_0x17 >> 2 & 1) != 0) {
    this->field_0x17 = this->field_0x17 & 0xfb;
    __end2 = ::std::
             vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ::begin(&this->children);
    child = (ElementPtr *)
            ::std::
            vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
            ::end(&this->children);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                                       *)&child), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                ::operator*(&__end2);
      pEVar2 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::operator->(this_01);
      pEVar2->field_0x17 = pEVar2->field_0x17 & 0xfd | 2;
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void Element::UpdateDefinition()
{
	if (dirty_definition)
	{
		dirty_definition = false;

		// Dirty definition implies all our descendent elements. Anything that can change the definition of this element can also change the
		// definition of any descendants due to the presence of RCSS descendant or child combinators. In principle this also applies to sibling
		// combinators, but those are handled during the DirtyDefinition call.
		dirty_child_definitions = true;

		GetStyle()->UpdateDefinition();
	}

	if (dirty_child_definitions)
	{
		dirty_child_definitions = false;
		for (const ElementPtr& child : children)
			child->dirty_definition = true;
	}
}